

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Source *pSVar10;
  Lexem *pLVar11;
  long *plVar12;
  ostream *poVar13;
  int i;
  uint uVar14;
  long lVar15;
  byte *pbVar16;
  string *args_2;
  iterator __nbytes;
  size_t __nbytes_00;
  long in_RDX;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  void *__buf;
  void *__buf_00;
  ulong uVar17;
  undefined7 uVar18;
  void *__buf_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *__buf_02;
  char **args;
  bool bVar19;
  char *pcVar20;
  char cVar21;
  byte bVar22;
  int i_6;
  char cVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  string *str;
  pointer pbVar27;
  Vec<const_char_*> lfc;
  Pool<Hpipe::Source,_32> source_pool;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> lfs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  disp;
  StreamSepMaker ss;
  int tmp;
  ErrorList error_list;
  Lexer lexer;
  CppEmitter ce;
  InstructionGraph ig;
  CharGraph cg;
  istringstream iss;
  uint local_eb4;
  char *local_eb0;
  char *local_ea8;
  char *local_ea0;
  long *local_e98;
  iterator iStack_e90;
  char **local_e88;
  ulong local_e78;
  ulong local_e70;
  undefined8 local_e68;
  undefined8 local_e60;
  undefined8 local_e58;
  undefined8 local_e50;
  Pool<Hpipe::Source,_32> local_e48;
  string local_e38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e18;
  string local_e00;
  string local_de0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dc0;
  StreamSepMaker local_da8;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_d20;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_cf0;
  string local_cc0 [16];
  ErrorList local_ac0;
  Lexer local_a30;
  CppEmitter local_900;
  StreamSep local_810;
  StreamSep local_7c8;
  StreamSep local_780;
  StreamSep local_738;
  StreamSep local_6f0;
  StreamSep local_6a8;
  StreamSep local_660;
  StreamSep local_618;
  StreamSep local_5d0;
  StreamSep local_588;
  StreamSep local_540;
  InstructionGraph local_4f8;
  CharGraph local_338;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  iVar9 = (int)in_RDX;
  if (argc < 2) {
LAB_0012f5bd:
    usage(*argv,"Please specify one or several input file",iVar9);
    return 2;
  }
  local_ea8 = "HPIPE_BUFFER";
  uVar26 = 1;
  iVar4 = 0;
  bVar7 = false;
  bVar19 = false;
  local_ea0 = "";
  uVar24 = 0;
  local_eb4 = 0;
  local_eb0 = (char *)0x0;
  local_e68 = 0;
  local_e60 = 0;
  local_e58 = 0;
  local_e50 = 0;
  local_e70 = 0;
  local_e78 = 0;
LAB_0012edec:
  iVar9 = (int)in_RDX;
  pcVar20 = argv[(int)uVar26];
  if (*pcVar20 == '-') {
    bVar3 = pcVar20[1];
    if (bVar3 == 0x2d) {
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "disp_lexem_graph"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') {
          bVar7 = true;
          goto LAB_0012f40d;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "disp_char_graph"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') {
          bVar19 = true;
          goto LAB_0012f40d;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "disp_inst_graph"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') goto LAB_0012f1e2;
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "disp_inst_pred"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') {
          uVar24 = 1;
          goto LAB_0012f40d;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "disp_trans_freq"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') goto LAB_0012f40d;
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "\nend_test"[lVar15 + 5];
        if (cVar23 == '\0' && cVar21 == '\0') {
          local_e78 = 1;
          goto LAB_0012f40d;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "benchmark"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') {
          local_e70 = 1;
          goto LAB_0012f40d;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "boyer_moore"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') {
          local_e50 = 1;
          goto LAB_0012f40d;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "trace_labels"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') {
          local_e58 = 1;
          goto LAB_0012f40d;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "no_training"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') {
          local_e60 = 1;
          goto LAB_0012f40d;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "never_ending"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') {
          local_e68 = 1;
          goto LAB_0012f40d;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "output"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') goto LAB_0012f249;
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "style"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') goto LAB_0012f26d;
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "stop_char"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') {
          uVar14 = uVar26 + 1;
          if ((argc <= (int)uVar14) ||
             (bVar6 = _preparg_atoi((int *)local_cc0,argv[(int)uVar14]), uVar26 = uVar14, !bVar6))
          goto LAB_0012f35f;
          iVar9 = 4;
          local_eb4 = (uint)local_cc0[0]._M_dataplus._M_p;
          in_RDX = extraout_RDX_00;
          goto LAB_0012f3fc;
        }
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        cVar21 = "args"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') goto LAB_0012f1cf;
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
      lVar15 = 0;
      do {
        cVar23 = pcVar20[lVar15 + 2];
        in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),cVar23);
        iVar8 = (int)in_RDX;
        cVar21 = "help"[lVar15];
        if (cVar23 == '\0' && cVar21 == '\0') goto LAB_0012f4b7;
        if (cVar21 == '_') {
          cVar21 = '-';
        }
        lVar15 = lVar15 + 1;
      } while (cVar23 == cVar21);
    }
    pbVar16 = (byte *)(pcVar20 + 2);
    in_RDX = 0;
    bVar22 = bVar3;
    do {
      iVar9 = (int)in_RDX;
      if (bVar22 < 0x6c) {
        if (bVar22 == 0x62) {
          local_e70 = 1;
        }
        else if (bVar22 == 99) {
          bVar19 = true;
        }
        else if (bVar22 != 0x66) goto LAB_0012f16b;
      }
      else if (bVar22 == 0x6c) {
        bVar7 = true;
      }
      else if (bVar22 == 0x70) {
        uVar24 = 1;
      }
      else {
        if (bVar22 != 0x74) goto LAB_0012f16b;
        local_e78 = 1;
      }
      bVar22 = *pbVar16;
      pbVar16 = pbVar16 + 1;
      in_RDX = 1;
    } while( true );
  }
  goto LAB_0012f4d4;
LAB_0012fa84:
  if (bVar7) goto LAB_0012fd16;
  if (0x68 < bVar3) {
    if (bVar3 == 0x73) {
      if (pcVar20[2] == '\0') {
LAB_0012fb74:
        uVar26 = uVar26 + 1;
        if (uVar17 <= (ulong)(long)(int)uVar26) {
          printf("%s","Error: ");
          putchar(0x73);
          printf("%s"," or --");
          _preparg_dispu("style");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar20 = "";
          if ((char *)*local_e98 != (char *)0x0) {
            pcVar20 = (char *)*local_e98;
          }
          printf("%s",pcVar20);
          puts(" --help\' for more information.");
          iVar9 = 0xf;
          goto LAB_00130651;
        }
        local_ea8 = (char *)plVar12[uVar26];
      }
      else {
        local_ea8 = pcVar20 + 2;
      }
    }
    else if (bVar3 == 0x6f) {
      if (pcVar20[2] == '\0') {
LAB_0012fb54:
        uVar26 = uVar26 + 1;
        if (uVar17 <= (ulong)(long)(int)uVar26) {
          printf("%s","Error: ");
          putchar(0x6f);
          printf("%s"," or --");
          _preparg_dispu("output");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar20 = "";
          if ((char *)*local_e98 != (char *)0x0) {
            pcVar20 = (char *)*local_e98;
          }
          printf("%s",pcVar20);
          puts(" --help\' for more information.");
          iVar9 = 0xe;
          goto LAB_00130651;
        }
        local_eb0 = (char *)plVar12[uVar26];
      }
      else {
        local_eb0 = pcVar20 + 2;
      }
    }
    else {
      if (bVar3 != 0x69) goto LAB_0012fd2f;
      if (pcVar20[2] == '\0') {
LAB_0012faf5:
        uVar26 = uVar26 + 1;
        if (uVar17 <= (ulong)(long)(int)uVar26) {
          printf("%s","Error: ");
          putchar(0x69);
          printf("%s"," or --");
          _preparg_dispu("disp_inst_graph");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar20 = "";
          if ((char *)*local_e98 != (char *)0x0) {
            pcVar20 = (char *)*local_e98;
          }
          printf("%s",pcVar20);
          puts(" --help\' for more information.");
          iVar9 = 5;
          goto LAB_00130651;
        }
        local_ea0 = (char *)plVar12[uVar26];
      }
      else {
        local_ea0 = pcVar20 + 2;
      }
    }
    goto LAB_0012fd16;
  }
  if (bVar3 != 0) {
    if (bVar3 != 0x61) {
      if (bVar3 == 0x68) {
LAB_001307f5:
        iVar9 = 0;
        usage((char *)*plVar12,(char *)0x0,(int)uVar17);
        goto LAB_00130651;
      }
      goto LAB_0012fd2f;
    }
    if (pcVar20[2] == '\0') {
LAB_0012fae1:
      uVar26 = uVar26 + 1;
      if (uVar17 <= (ulong)(long)(int)uVar26) {
        printf("%s","Error: ");
        putchar(0x61);
        printf("%s"," or --");
        _preparg_dispu("args");
        puts(" must be followed by an argument.\n");
        printf("%s","Try \'");
        pcVar20 = "";
        if ((char *)*local_e98 != (char *)0x0) {
          pcVar20 = (char *)*local_e98;
        }
        printf("%s",pcVar20);
        puts(" --help\' for more information.");
        iVar9 = 0x11;
        goto LAB_00130651;
      }
    }
    goto LAB_0012fd16;
  }
  if (pcVar20[2] == '\0') {
    uVar26 = uVar26 + 1;
    if ((ulong)(long)(int)uVar26 < uVar17) {
      pcVar20 = (char *)plVar12[uVar26];
      goto LAB_0012fbaa;
    }
LAB_0012fc76:
    printf("%s","Error: ");
    putchar(0);
    printf("%s"," or --");
    _preparg_dispu("stop_char");
    puts(" must be followed by an integer.\n");
    printf("%s","Try \'");
    pcVar20 = (char *)*local_e98;
    if (pcVar20 == (char *)0x0) {
      pcVar20 = "";
    }
    printf("%s",pcVar20);
    puts(" --help\' for more information.");
    iVar8 = 1;
    iVar9 = 0x10;
  }
  else {
    pcVar20 = pcVar20 + 2;
LAB_0012fbaa:
    bVar7 = _preparg_atoi((int *)local_cc0,pcVar20);
    if (!bVar7) goto LAB_0012fc76;
    iVar8 = 0xf;
    local_eb4 = (uint)local_cc0[0]._M_dataplus._M_p;
  }
LAB_0012fd03:
  plVar12 = local_e98;
  __nbytes._M_current = iStack_e90._M_current;
  iVar4 = iVar9;
  if (iVar8 != 0xf) goto LAB_00130651;
LAB_0012fd16:
  uVar25 = (ulong)(uVar26 + 1);
  uVar17 = (long)__nbytes._M_current - (long)plVar12 >> 3;
  if (uVar17 <= (ulong)(long)(int)(uVar26 + 1)) goto LAB_0012fd2f;
  goto LAB_0012f6d3;
LAB_0012f16b:
  if (in_RDX != 0) goto LAB_0012f40d;
  if (bVar3 < 0x69) {
    if (bVar3 == 0) {
      if (pcVar20[2] == '\0') {
        uVar26 = uVar26 + 1;
        if ((int)uVar26 < argc) {
          pcVar20 = argv[(int)uVar26];
          goto LAB_0012f2ab;
        }
LAB_0012f35f:
        printf("%s","Error: ");
        putchar(0);
        printf("%s"," or --");
        _preparg_dispu("stop_char");
        puts(" must be followed by an integer.\n");
        printf("%s","Try \'");
        pcVar20 = *argv;
        if (pcVar20 == (char *)0x0) {
          pcVar20 = "";
        }
        printf("%s",pcVar20);
        puts(" --help\' for more information.");
        iVar4 = 0x10;
        iVar9 = 1;
        in_RDX = extraout_RDX_01;
      }
      else {
        pcVar20 = pcVar20 + 2;
LAB_0012f2ab:
        bVar6 = _preparg_atoi((int *)local_cc0,pcVar20);
        if (!bVar6) goto LAB_0012f35f;
        iVar9 = 4;
        local_eb4 = (uint)local_cc0[0]._M_dataplus._M_p;
        in_RDX = extraout_RDX;
      }
LAB_0012f3fc:
      if (iVar9 != 4) {
        return iVar4;
      }
LAB_0012f40d:
      iVar9 = (int)in_RDX;
      uVar26 = uVar26 + 1;
      if (argc <= (int)uVar26) goto LAB_0012f5bd;
      goto LAB_0012edec;
    }
    if (bVar3 == 0x61) {
      if (pcVar20[2] == '\0') {
LAB_0012f1cf:
        uVar26 = uVar26 + 1;
        if (argc <= (int)uVar26) {
          printf("%s","Error: ");
          putchar(0x61);
          printf("%s"," or --");
          _preparg_dispu("args");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar20 = "";
          if (*argv != (char *)0x0) {
            pcVar20 = *argv;
          }
          printf("%s",pcVar20);
          puts(" --help\' for more information.");
          return 0x11;
        }
      }
      goto LAB_0012f40d;
    }
    iVar8 = 0;
    if (bVar3 == 0x68) {
LAB_0012f4b7:
      usage(*argv,(char *)0x0,iVar8);
      return 0;
    }
  }
  else {
    if (bVar3 == 0x73) {
      if (pcVar20[2] == '\0') {
LAB_0012f26d:
        uVar26 = uVar26 + 1;
        if (argc <= (int)uVar26) {
          printf("%s","Error: ");
          putchar(0x73);
          printf("%s"," or --");
          _preparg_dispu("style");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar20 = "";
          if (*argv != (char *)0x0) {
            pcVar20 = *argv;
          }
          printf("%s",pcVar20);
          puts(" --help\' for more information.");
          return 0xf;
        }
        local_ea8 = argv[(int)uVar26];
      }
      else {
        local_ea8 = pcVar20 + 2;
      }
      goto LAB_0012f40d;
    }
    if (bVar3 == 0x6f) {
      if (pcVar20[2] == '\0') {
LAB_0012f249:
        uVar26 = uVar26 + 1;
        if (argc <= (int)uVar26) {
          printf("%s","Error: ");
          putchar(0x6f);
          printf("%s"," or --");
          _preparg_dispu("output");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar20 = "";
          if (*argv != (char *)0x0) {
            pcVar20 = *argv;
          }
          printf("%s",pcVar20);
          puts(" --help\' for more information.");
          return 0xe;
        }
        local_eb0 = argv[(int)uVar26];
      }
      else {
        local_eb0 = pcVar20 + 2;
      }
      goto LAB_0012f40d;
    }
    if (bVar3 == 0x69) {
      if (pcVar20[2] == '\0') {
LAB_0012f1e2:
        uVar26 = uVar26 + 1;
        if (argc <= (int)uVar26) {
          printf("%s","Error: ");
          putchar(0x69);
          printf("%s"," or --");
          _preparg_dispu("disp_inst_graph");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar20 = "";
          if (*argv != (char *)0x0) {
            pcVar20 = *argv;
          }
          printf("%s",pcVar20);
          puts(" --help\' for more information.");
          return 5;
        }
        local_ea0 = argv[(int)uVar26];
      }
      else {
        local_ea0 = pcVar20 + 2;
      }
      goto LAB_0012f40d;
    }
  }
LAB_0012f4d4:
  if ((int)uVar26 < 0) goto LAB_0012f5bd;
  Hpipe::ErrorList::ErrorList(&local_ac0);
  local_e48.last = (Set *)0x0;
  local_e48.used = 0x20;
  Hpipe::Lexer::Lexer(&local_a30,&local_ac0,&local_e48);
  if (!bVar7) {
    args_2 = local_cc0;
    local_cc0[0]._M_dataplus._M_p = local_cc0[0]._M_dataplus._M_p & 0xffffffffffffff00;
    pSVar10 = Hpipe::Pool<Hpipe::Source,32>::New<char_const(&)[22],char(&)[6897],bool>
                        ((Pool<Hpipe::Source,32> *)&local_e48,(char (*) [22])"src/Hpipe/predef.sipe"
                         ,&predef,(bool *)args_2);
    Hpipe::Lexer::read(&local_a30,(int)pSVar10,__buf,(size_t)args_2);
  }
  if ((int)uVar26 < argc) {
    args = argv + uVar26;
    do {
      pSVar10 = Hpipe::Pool<Hpipe::Source,32>::New<char*&>
                          ((Pool<Hpipe::Source,32> *)&local_e48,args);
      Hpipe::Lexer::read(&local_a30,(int)pSVar10,__buf_00,(size_t)argv);
      args = args + 1;
      uVar26 = uVar26 + 1;
    } while ((int)uVar26 < argc);
  }
  if (bVar7) {
    pLVar11 = Hpipe::Lexer::root(&local_a30);
    iVar9 = 0;
    Hpipe::Lexem::display_dot(pLVar11,".res.dot",(char *)0x0);
    goto LAB_00130675;
  }
  bVar7 = Hpipe::ErrorList::operator_cast_to_bool(&local_ac0);
  iVar9 = 1;
  if (!bVar7) goto LAB_00130675;
  Hpipe::Lexer::flags_abi_cxx11_
            ((Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_e18,&local_a30);
  local_e98 = (long *)0x0;
  iStack_e90._M_current = (char **)0x0;
  local_e88 = (char **)0x0;
  local_cc0[0]._M_dataplus._M_p = "beg_flags section";
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_e98,(iterator)0x0,
             (char **)local_cc0);
  if (local_e18.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_e18.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar27 = local_e18.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_cc0[0]._M_dataplus._M_p = (pbVar27->_M_dataplus)._M_p;
      if (iStack_e90._M_current == local_e88) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_e98,iStack_e90,
                   (char **)local_cc0);
      }
      else {
        *iStack_e90._M_current = local_cc0[0]._M_dataplus._M_p;
        iStack_e90._M_current = iStack_e90._M_current + 1;
      }
      pbVar27 = pbVar27 + 1;
    } while (pbVar27 !=
             local_e18.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  uVar17 = (long)iStack_e90._M_current - (long)local_e98 >> 3;
  __nbytes._M_current = iStack_e90._M_current;
  if (1 < uVar17) {
    uVar25 = 1;
    plVar12 = local_e98;
LAB_0012f6d3:
    uVar26 = (uint)uVar25;
    pcVar20 = (char *)plVar12[uVar25];
    if (*pcVar20 == '-') {
      bVar3 = pcVar20[1];
      iVar9 = iVar4;
      if (bVar3 == 0x2d) {
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "disp_lexem_graph"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') goto LAB_0012fd16;
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "disp_char_graph"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') {
            bVar19 = true;
            goto LAB_0012fd16;
          }
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "disp_inst_graph"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') goto LAB_0012faf5;
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "disp_inst_pred"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') {
            uVar24 = 1;
            goto LAB_0012fd16;
          }
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "disp_trans_freq"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') goto LAB_0012fd16;
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "\nend_test"[lVar15 + 5];
          uVar18 = (undefined7)(uVar17 >> 8);
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') {
            local_e78 = CONCAT71(uVar18,1);
            goto LAB_0012fd16;
          }
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "benchmark"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') {
            local_e70 = CONCAT71(uVar18,1);
            goto LAB_0012fd16;
          }
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "boyer_moore"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') {
            local_e50 = CONCAT71(uVar18,1);
            goto LAB_0012fd16;
          }
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "trace_labels"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') {
            local_e58 = CONCAT71(uVar18,1);
            goto LAB_0012fd16;
          }
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "no_training"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') {
            local_e60 = CONCAT71(uVar18,1);
            goto LAB_0012fd16;
          }
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "never_ending"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') {
            local_e68 = CONCAT71(uVar18,1);
            goto LAB_0012fd16;
          }
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "output"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') goto LAB_0012fb54;
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "style"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') goto LAB_0012fb74;
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "stop_char"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') {
            uVar14 = uVar26 + 1;
            if ((uVar17 <= (ulong)(long)(int)uVar14) ||
               (bVar7 = _preparg_atoi((int *)local_cc0,(char *)plVar12[uVar14]), uVar26 = uVar14,
               !bVar7)) goto LAB_0012fc76;
            iVar8 = 0xf;
            local_eb4 = (uint)local_cc0[0]._M_dataplus._M_p;
            goto LAB_0012fd03;
          }
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "args"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') goto LAB_0012fae1;
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
        lVar15 = 0;
        do {
          lVar5 = lVar15 + 2;
          cVar23 = "help"[lVar15];
          if (pcVar20[lVar5] == '\0' && cVar23 == '\0') goto LAB_001307f5;
          if (cVar23 == '_') {
            cVar23 = '-';
          }
          lVar15 = lVar15 + 1;
        } while (pcVar20[lVar5] == cVar23);
      }
      pbVar16 = (byte *)(pcVar20 + 2);
      bVar7 = false;
      bVar22 = bVar3;
      do {
        if (bVar22 < 0x6c) {
          if (bVar22 == 0x62) {
            local_e70 = 1;
          }
          else if (bVar22 == 99) {
            bVar19 = true;
          }
          else if (bVar22 != 0x66) goto LAB_0012fa84;
        }
        else if (bVar22 != 0x6c) {
          if (bVar22 == 0x70) {
            uVar24 = 1;
          }
          else {
            if (bVar22 != 0x74) goto LAB_0012fa84;
            local_e78 = 1;
          }
        }
        bVar22 = *pbVar16;
        pbVar16 = pbVar16 + 1;
        bVar7 = true;
      } while( true );
    }
  }
LAB_0012fd2f:
  Hpipe::CharGraph::CharGraph(&local_338,&local_a30);
  paVar1 = &local_cc0[0].field_2;
  local_cc0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cc0,"main","");
  pLVar11 = Hpipe::Lexer::find_machine(&local_a30,local_cc0);
  Hpipe::CharGraph::read(&local_338,(int)pLVar11,__buf_01,(size_t)__nbytes._M_current);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_cc0[0]._M_dataplus._M_p,
                    CONCAT71(local_cc0[0].field_2._M_allocated_capacity._1_7_,
                             local_cc0[0].field_2._M_local_buf[0]) + 1);
  }
  if (bVar19) {
    Hpipe::CharGraph::display_dot(&local_338,".char.dot",(char *)0x0);
  }
  iVar9 = 1;
  if (local_338.ok == true) {
    Hpipe::InstructionGraph::InstructionGraph(&local_4f8);
    iVar9 = strcmp(local_ea8,"C_STR");
    local_4f8.stop_char = -(uint)(iVar9 != 0) | local_eb4;
    local_4f8.boyer_moore = (bool)((byte)local_e50 & 1);
    local_4f8.no_training = (bool)((byte)local_e60 & 1);
    local_4f8.never_ending = (bool)((byte)local_e68 & 1);
    std::__cxx11::string::string((string *)local_cc0,local_ea0,(allocator *)&local_900);
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_cc0,_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cc0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_cc0[0]._M_dataplus._M_p,
                      CONCAT71(local_cc0[0].field_2._M_allocated_capacity._1_7_,
                               local_cc0[0].field_2._M_local_buf[0]) + 1);
    }
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator(&local_cf0,(istream_type *)local_1b0);
    paVar2 = &local_d20._M_value.field_2;
    local_d20._M_stream = (istream_type *)0x0;
    local_d20._M_value._M_string_length = 0;
    local_d20._M_value.field_2._M_local_buf[0] = '\0';
    local_d20._M_ok = false;
    local_d20._M_value._M_dataplus._M_p = (pointer)paVar2;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_dc0,
               &local_cf0,&local_d20,(allocator_type *)local_cc0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d20._M_value._M_dataplus._M_p != paVar2) {
      operator_delete(local_d20._M_value._M_dataplus._M_p,
                      CONCAT71(local_d20._M_value.field_2._M_allocated_capacity._1_7_,
                               local_d20._M_value.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cf0._M_value._M_dataplus._M_p != &local_cf0._M_value.field_2) {
      operator_delete(local_cf0._M_value._M_dataplus._M_p,
                      local_cf0._M_value.field_2._M_allocated_capacity + 1);
    }
    __nbytes_00 = (size_t)uVar24;
    Hpipe::InstructionGraph::read(&local_4f8,(int)&local_338,&local_dc0,__nbytes_00);
    Hpipe::CppEmitter::CppEmitter(&local_900);
    local_900.trace_labels = (bool)((byte)local_e58 & 1);
    iVar9 = strcmp(local_ea8,"HPIPE_CB_STRING_PTR");
    if (iVar9 == 0) {
      local_900.buffer_type = 0;
      __buf_02 = extraout_RDX_02;
LAB_001301eb:
      Hpipe::CppEmitter::read(&local_900,(int)&local_4f8,__buf_02,__nbytes_00);
      if ((local_e70 & 1) == 0) {
        if ((local_e78 & 1) != 0) goto LAB_00130256;
        local_cc0[0]._M_string_length = 0;
        local_cc0[0].field_2._M_local_buf[0] = '\0';
        local_de0._M_string_length = 0;
        local_de0.field_2._M_local_buf[0] = '\0';
        local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
        local_de0._M_dataplus._M_p = (pointer)&local_de0.field_2;
        local_cc0[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e38,"\n","");
        local_e00._M_string_length = 0;
        local_e00.field_2._M_local_buf[0] = '\0';
        local_e00._M_dataplus._M_p = (pointer)&local_e00.field_2;
        Hpipe::StreamSepMaker::StreamSepMaker
                  (&local_da8,(TS *)&std::cout,local_cc0,&local_de0,&local_e38,&local_e00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e00._M_dataplus._M_p != &local_e00.field_2) {
          operator_delete(local_e00._M_dataplus._M_p,
                          CONCAT71(local_e00.field_2._M_allocated_capacity._1_7_,
                                   local_e00.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
          operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_de0._M_dataplus._M_p != &local_de0.field_2) {
          operator_delete(local_de0._M_dataplus._M_p,
                          CONCAT71(local_de0.field_2._M_allocated_capacity._1_7_,
                                   local_de0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cc0[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_cc0[0]._M_dataplus._M_p,
                          CONCAT71(local_cc0[0].field_2._M_allocated_capacity._1_7_,
                                   local_cc0[0].field_2._M_local_buf[0]) + 1);
        }
        std::ofstream::ofstream(local_cc0);
        if (local_eb0 != (char *)0x0) {
          std::ofstream::open((char *)local_cc0,(_Ios_Openmode)local_eb0);
          local_da8.stream = (TS *)local_cc0;
        }
        Hpipe::StreamSepMaker::operator<<
                  (&local_540,&local_da8,
                   (char (*) [104])
                   "// ----------------------------------------------------------------------------------------------------"
                  );
        Hpipe::StreamSep::~StreamSep(&local_540);
        Hpipe::StreamSepMaker::operator<<
                  (&local_588,&local_da8,(char (*) [27])"#ifdef HPIPE_PRELIMINARIES");
        Hpipe::StreamSep::~StreamSep(&local_588);
        Hpipe::CppEmitter::write_preliminaries(&local_900,&local_da8);
        Hpipe::StreamSepMaker::operator<<
                  (&local_5d0,&local_da8,(char (*) [30])"#endif // HPIPE_PRELIMINARIES");
        Hpipe::StreamSep::~StreamSep(&local_5d0);
        Hpipe::StreamSepMaker::operator<<(&local_618,&local_da8,(char (*) [1])0x17a108);
        Hpipe::StreamSep::~StreamSep(&local_618);
        Hpipe::StreamSepMaker::operator<<
                  (&local_660,&local_da8,
                   (char (*) [104])
                   "// ----------------------------------------------------------------------------------------------------"
                  );
        Hpipe::StreamSep::~StreamSep(&local_660);
        Hpipe::StreamSepMaker::operator<<
                  (&local_6a8,&local_da8,(char (*) [26])"#ifdef HPIPE_DECLARATIONS");
        Hpipe::StreamSep::~StreamSep(&local_6a8);
        Hpipe::CppEmitter::write_declarations(&local_900,&local_da8);
        Hpipe::StreamSepMaker::operator<<
                  (&local_6f0,&local_da8,(char (*) [29])"#endif // HPIPE_DECLARATIONS");
        Hpipe::StreamSep::~StreamSep(&local_6f0);
        Hpipe::StreamSepMaker::operator<<(&local_738,&local_da8,(char (*) [1])0x17a108);
        Hpipe::StreamSep::~StreamSep(&local_738);
        Hpipe::StreamSepMaker::operator<<
                  (&local_780,&local_da8,
                   (char (*) [104])
                   "// ----------------------------------------------------------------------------------------------------"
                  );
        Hpipe::StreamSep::~StreamSep(&local_780);
        Hpipe::StreamSepMaker::operator<<
                  (&local_7c8,&local_da8,(char (*) [25])"#ifdef HPIPE_DEFINITIONS");
        Hpipe::StreamSep::~StreamSep(&local_7c8);
        Hpipe::CppEmitter::write_definitions(&local_900,&local_da8);
        Hpipe::StreamSepMaker::operator<<
                  (&local_810,&local_da8,(char (*) [28])"#endif // HPIPE_DEFINITIONS");
        Hpipe::StreamSep::~StreamSep(&local_810);
        std::ofstream::~ofstream(local_cc0);
        Hpipe::StreamSepMaker::~StreamSepMaker(&local_da8);
        iVar9 = 0;
      }
      else {
        Hpipe::Lexer::training_data((Vec<Hpipe::Lexer::TrainingData> *)local_cc0,&local_a30);
        Hpipe::CppEmitter::bench
                  (&local_900,
                   (vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                    *)local_cc0);
        std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::
        ~vector((vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *)
                local_cc0);
        iVar9 = 0;
        if ((local_e78 & 1) != 0) {
LAB_00130256:
          Hpipe::Lexer::test_data((Vec<Hpipe::Lexer::TestData> *)local_cc0,&local_a30);
          iVar9 = Hpipe::CppEmitter::test
                            (&local_900,
                             (vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_>
                              *)local_cc0);
          std::vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_>::~vector
                    ((vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_> *)
                     local_cc0);
        }
      }
    }
    else {
      iVar9 = strcmp(local_ea8,"HPIPE_BUFFER");
      if (iVar9 == 0) {
        local_900.buffer_type = 1;
        __buf_02 = extraout_RDX_03;
        goto LAB_001301eb;
      }
      iVar9 = strcmp(local_ea8,"BEG_END");
      if (iVar9 == 0) {
        local_900.buffer_type = 2;
        __buf_02 = extraout_RDX_04;
        goto LAB_001301eb;
      }
      iVar9 = strcmp(local_ea8,"C_STR");
      if (iVar9 == 0) {
        local_900.buffer_type = 3;
        __buf_02 = extraout_RDX_05;
        goto LAB_001301eb;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parse style ( ",0x16);
      poVar13 = std::operator<<((ostream *)&std::cerr,local_ea8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13," ). Possible values are HPIPE_BUFFER, BEG_END or C_STR",0x36);
      iVar9 = 1;
      std::endl<char,std::char_traits<char>>(poVar13);
    }
    Hpipe::CppEmitter::~CppEmitter(&local_900);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_dc0);
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    Hpipe::InstructionGraph::~InstructionGraph(&local_4f8);
  }
  Hpipe::CharGraph::~CharGraph(&local_338);
LAB_00130651:
  if (local_e98 != (long *)0x0) {
    operator_delete(local_e98,(long)local_e88 - (long)local_e98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e18);
LAB_00130675:
  Hpipe::Pool<Hpipe::Lexem,_32>::~Pool(&local_a30.lexem_pool);
  if (local_a30.stack_last.super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a30.stack_last.
                    super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a30.stack_last.
                          super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a30.stack_last.
                          super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30.first_item.str._M_dataplus._M_p != &local_a30.first_item.str.field_2) {
    operator_delete(local_a30.first_item.str._M_dataplus._M_p,
                    local_a30.first_item.str.field_2._M_allocated_capacity + 1);
  }
  Hpipe::Pool<Hpipe::Source,_32>::~Pool(&local_e48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.out.end._M_dataplus._M_p != &local_ac0.out.end.field_2) {
    operator_delete(local_ac0.out.end._M_dataplus._M_p,
                    local_ac0.out.end.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.out.sep._M_dataplus._M_p != &local_ac0.out.sep.field_2) {
    operator_delete(local_ac0.out.sep._M_dataplus._M_p,
                    local_ac0.out.sep.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.out.beg._M_dataplus._M_p != &local_ac0.out.beg.field_2) {
    operator_delete(local_ac0.out.beg._M_dataplus._M_p,
                    local_ac0.out.beg.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.out.first_beg._M_dataplus._M_p != &local_ac0.out.first_beg.field_2) {
    operator_delete(local_ac0.out.first_beg._M_dataplus._M_p,
                    local_ac0.out.first_beg.field_2._M_allocated_capacity + 1);
  }
  return iVar9;
}

Assistant:

int main( int argc, char **argv ) {
    // args
    #include <PrepArg/declarations.h>
    #include <PrepArg/parse.h>
    if ( beg_files < 0 )
        return usage( argv[ 0 ], "Please specify one or several input file", 2 );

    try {
        // lexems
        ErrorList error_list;
        Pool<Source> source_pool;
        Lexer lexer( error_list, source_pool );
        if ( not disp_lexem_graph )
            lexer.read( source_pool.New( "src/Hpipe/predef.sipe", predef, false ) );
        for( int i = beg_files; i < argc; ++i )
            lexer.read( source_pool.New( argv[ i ] ) );
        if ( disp_lexem_graph ) {
            lexer.root()->display_dot();
            return 0;
        }
        if ( ! error_list )
            return 1;

        // update flags
        Vec<std::string> lfs = lexer.flags();
        Vec<const char *> lfc;
        lfc << "beg_flags section";
        for( std::string &str : lfs )
            lfc << str.c_str();
        #undef PREPARG_ARGV
        #undef PREPARG_ARGC
        #define PREPARG_ARGC lfc.size()
        #define PREPARG_ARGV lfc
        #include <PrepArg/parse.h>

        // char and transitions
        CharGraph cg( lexer );
        cg.read( lexer.find_machine( "main" ) );
        if ( disp_char_graph )
            cg.display_dot();
        if ( ! cg.ok )
            return 1;

        // instruction graph
        InstructionGraph ig;
        ig.stop_char    = strcmp( style, "C_STR" ) == 0 ? stop_char : -1;
        ig.boyer_moore  = boyer_moore;
        ig.no_training  = no_training;
        ig.never_ending = never_ending;

        std::istringstream iss( disp_inst_graph );
        std::vector<std::string> disp( std::istream_iterator<std::string>{ iss }, std::istream_iterator<std::string>{} );
        ig.read( &cg, disp, disp_inst_pred, disp_trans_freq );

        // emitter
        CppEmitter ce;
        ce.trace_labels = trace_labels;

        if      ( strcmp( style, "HPIPE_CB_STRING_PTR" ) == 0 ) { ce.buffer_type = CppEmitter::BT_HPIPE_CB_STRING_PTR; }
        else if ( strcmp( style, "HPIPE_BUFFER"        ) == 0 ) { ce.buffer_type = CppEmitter::BT_HPIPE_BUFFER       ; }
        else if ( strcmp( style, "BEG_END"             ) == 0 ) { ce.buffer_type = CppEmitter::BT_BEG_END            ; }
        else if ( strcmp( style, "C_STR"               ) == 0 ) { ce.buffer_type = CppEmitter::BT_C_STR              ; }
        else { std::cerr << "Unknown parse style ( " << style << " ). Possible values are HPIPE_BUFFER, BEG_END or C_STR" << std::endl; return 1; }

        ce.read( &ig );

        // output/test
        if ( benchmark )
            ce.bench( lexer.training_data() );

        if ( test )
            return ce.test( lexer.test_data() );

        if ( benchmark )
            return 0;

        StreamSepMaker ss( std::cout );
        std::ofstream fout;
        if ( output ) {
            fout.open( output );
            ss.stream = &fout;
        }

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_PRELIMINARIES";
        ce.write_preliminaries( ss );
        ss << "#endif // HPIPE_PRELIMINARIES";
        ss << "";

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_DECLARATIONS";
        ce.write_declarations( ss );
        ss << "#endif // HPIPE_DECLARATIONS";
        ss << "";

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_DEFINITIONS";
        ce.write_definitions( ss );
        ss << "#endif // HPIPE_DEFINITIONS";

        return 0;
    } catch ( const char *msg ) {
        std::cerr << msg << std::endl;
        return 1;
    }
}